

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::pp_else(CTcTokenizer *this)

{
  tok_if_t tVar1;
  tc_toktyp_t tVar2;
  int iVar3;
  
  tVar2 = next_on_line(this);
  if (tVar2 != TOKT_EOF) {
    log_error(0x2720);
  }
  iVar3 = this->if_sp_;
  if (this->str_->init_if_level_ < iVar3) {
    if (iVar3 != 0) {
      tVar1 = this->if_stack_[(long)iVar3 + -1].state;
      if (TOKIF_ELSE_NO < tVar1) goto LAB_0024b585;
      if ((0x31U >> (tVar1 & 0x1f) & 1) == 0) {
        if ((10U >> (tVar1 & 0x1f) & 1) == 0) {
          this->if_stack_[(long)iVar3 + -1].state = TOKIF_ELSE_YES;
        }
        else {
          this->if_stack_[(long)iVar3 + -1].state = TOKIF_ELSE_NO;
        }
        goto LAB_0024b585;
      }
    }
    iVar3 = 0x2722;
  }
  else {
    iVar3 = 0x2740;
  }
  log_error(iVar3);
LAB_0024b585:
  clear_linebuf(this);
  return;
}

Assistant:

void CTcTokenizer::pp_else()
{
    /* make sure there's nothing but whitespace on the line */
    if (next_on_line() != TOKT_EOF)
        log_error(TCERR_PP_EXTRA);

    /* 
     *   make sure that the #else occurs in the same file as the
     *   corresponding #if 
     */
    if (if_sp_ <= str_->get_init_if_level())
    {
        /* log the error */
        log_error(TCERR_PP_ELSE_NOT_IN_SAME_FILE);

        /* clear the text and abort */
        clear_linebuf();
        return;
    }

    /* check our current #if state */
    switch(get_if_state())
    {
    case TOKIF_IF_YES:
    case TOKIF_IF_DONE:
        /* 
         *   we've already taken a true #if branch, so we don't want to
         *   process the #else part - switch to a false #else branch 
         */
        change_if_state(TOKIF_ELSE_NO);
        break;

    case TOKIF_IF_NO:
        /* 
         *   we haven't yet found a true #if branch, so take the #else
         *   branch -- switch to a true #else branch 
         */
        change_if_state(TOKIF_ELSE_YES);
        break;

    case TOKIF_NONE:
    case TOKIF_ELSE_YES:
    case TOKIF_ELSE_NO:
        /* 
         *   we're not in a #if at all, or we're in a #else - log an error
         *   and ignore it 
         */
        log_error(TCERR_PP_ELSE_WITHOUT_IF);
        break;
    }

    /* don't retain the directive in the preprocessed source */
    clear_linebuf();
}